

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O3

char * speex_resampler_strerror(int err)

{
  if ((uint)err < 5) {
    return &DAT_00146f20 + *(int *)(&DAT_00146f20 + (ulong)(uint)err * 4);
  }
  return "Unknown error. Bad error code or strange version mismatch.";
}

Assistant:

EXPORT const char *speex_resampler_strerror(int err)
{
   switch (err)
   {
      case RESAMPLER_ERR_SUCCESS:
         return "Success.";
      case RESAMPLER_ERR_ALLOC_FAILED:
         return "Memory allocation failed.";
      case RESAMPLER_ERR_BAD_STATE:
         return "Bad resampler state.";
      case RESAMPLER_ERR_INVALID_ARG:
         return "Invalid argument.";
      case RESAMPLER_ERR_PTR_OVERLAP:
         return "Input and output buffers overlap.";
      default:
         return "Unknown error. Bad error code or strange version mismatch.";
   }
}